

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToBuffer::prepare
          (BufferCopyToBuffer *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar1;
  Context *pCVar2;
  DeviceInterface *pDVar3;
  VkPhysicalDevice physicalDevice;
  VkDevice pVVar4;
  VkBuffer obj;
  VkDeviceMemory obj_00;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  VkAllocationCallbacks *pVVar7;
  Handle<(vk::HandleType)8> in_stack_ffffffffffffff48;
  Handle<(vk::HandleType)8> obj_01;
  VkDeviceMemory obj_02;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b0;
  InstanceInterface *local_90;
  undefined1 local_88 [20];
  uint uStack_74;
  VkAllocationCallbacks *pVStack_70;
  undefined8 local_68;
  deUint32 local_60;
  pointer local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pCVar2 = context->m_context;
  local_90 = pCVar2->m_vki;
  pDVar3 = pCVar2->m_vkd;
  physicalDevice = pCVar2->m_physicalDevice;
  pVVar4 = pCVar2->m_device;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,&pCVar2->m_queueFamilies);
  pVStack_70 = (VkAllocationCallbacks *)context->m_currentBufferSize;
  this->m_bufferSize = (VkDeviceSize)pVStack_70;
  local_88._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_88._8_8_ = (void *)0x0;
  stack0xffffffffffffff88 = (VkDevice)((ulong)uStack_74 << 0x20);
  local_68._0_4_ = 2;
  local_68._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  local_60 = (deUint32)
             ((ulong)((long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_58 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&stack0xffffffffffffff48,pDVar3,pVVar4,
                     (VkBufferCreateInfo *)local_88,(VkAllocationCallbacks *)0x0);
  pVVar7 = DStack_b0.m_allocator;
  pVVar6 = DStack_b0.m_device;
  pDVar5 = DStack_b0.m_deviceIface;
  stack0xffffffffffffff88 = DStack_b0.m_device;
  pVStack_70 = DStack_b0.m_allocator;
  local_88._8_8_ = DStack_b0.m_deviceIface;
  obj_01.m_internal = 0;
  DStack_b0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_b0.m_device = (VkDevice)0x0;
  DStack_b0.m_allocator = (VkAllocationCallbacks *)0x0;
  pMVar1 = &this->m_dstBuffer;
  obj.m_internal =
       (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         pVVar6;
    (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVVar7;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         in_stack_ffffffffffffff48.m_internal;
    (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         pDVar5;
  }
  else {
    local_88._0_8_ = in_stack_ffffffffffffff48.m_internal;
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj
              );
    (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         stack0xffffffffffffff88;
    (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVStack_70;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         local_88._0_8_;
    (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_88._8_8_;
    if (obj_01.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&DStack_b0,(VkBuffer)obj_01.m_internal);
    }
  }
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&stack0xffffffffffffff48,local_90,pDVar3,
                   physicalDevice,pVVar4,
                   (VkBuffer)
                   (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal,
                   (VkMemoryPropertyFlags)obj_01.m_internal);
  pVVar7 = DStack_b0.m_allocator;
  pVVar4 = DStack_b0.m_device;
  pDVar3 = DStack_b0.m_deviceIface;
  stack0xffffffffffffff88 = DStack_b0.m_device;
  pVStack_70 = DStack_b0.m_allocator;
  local_88._8_8_ = DStack_b0.m_deviceIface;
  obj_02.m_internal = 0;
  DStack_b0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_b0.m_device = (VkDevice)0x0;
  DStack_b0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_88._0_8_ = obj_01.m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = pVVar4;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         pVVar7;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
         obj_01.m_internal;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,obj_00
              );
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
         stack0xffffffffffffff88;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         pVStack_70;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
         local_88._0_8_;
    (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_88._8_8_;
    if (obj_02.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&DStack_b0,obj_02);
    }
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BufferCopyToBuffer::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_bufferSize = context.getBufferSize();

	m_dstBuffer	= createBuffer(vkd, device, m_bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies);
	m_memory	= bindBufferMemory(vki, vkd, physicalDevice, device, *m_dstBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT);
}